

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# state.c
# Opt level: O0

int STATE_checkers_and_pinners
              (chess_state_t *s,bitboard_t *block_check,bitboard_t *pinners,bitboard_t *pinned)

{
  ulong uVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  bitboard_t *pbVar5;
  ulong uVar6;
  ulong bitboard;
  bitboard_t opponent_between;
  bitboard_t own_between;
  bitboard_t between;
  bitboard_t attacker_bb;
  ulong uStack_58;
  int attack_pos;
  bitboard_t attackers;
  bitboard_t checkers;
  int king_pos;
  bitboard_t *opponent_bb;
  bitboard_t *player_bb;
  int opponent;
  int player;
  bitboard_t *pinned_local;
  bitboard_t *pinners_local;
  bitboard_t *block_check_local;
  chess_state_t *s_local;
  
  uVar2 = (uint)s->player;
  pbVar5 = s->bitboard + (int)((uVar2 ^ 1) * 7);
  iVar3 = BITBOARD_find_bit(s->bitboard[(long)(int)(uVar2 * 7) + 5]);
  *block_check = 0;
  *pinners = 0;
  *pinned = 0;
  attackers = bitboard_knight[iVar3] & pbVar5[1] |
              bitboard_pawn_capture[(int)uVar2][iVar3] & *pbVar5;
  for (uStack_58 = bitboard_bishop[iVar3] & (pbVar5[2] | pbVar5[4]) |
                   bitboard_rook[iVar3] & (pbVar5[3] | pbVar5[4]); uStack_58 != 0;
      uStack_58 = uVar6 ^ uStack_58) {
    iVar4 = BITBOARD_find_bit(uStack_58);
    uVar6 = 1L << ((byte)iVar4 & 0x3f);
    uVar1 = bitboard_between[iVar4][iVar3];
    bitboard = uVar1 & s->bitboard[(long)(int)(uVar2 * 7) + 6];
    if ((uVar1 & pbVar5[6]) == 0) {
      if (bitboard == 0) {
        attackers = uVar6 | attackers;
        *block_check = uVar1 | *block_check;
      }
      else {
        iVar4 = BITBOARD_count_bits(bitboard);
        if (iVar4 == 1) {
          *pinners = uVar6 | *pinners;
          *pinned = bitboard | *pinned;
        }
      }
    }
  }
  *block_check = attackers | *block_check;
  iVar3 = BITBOARD_count_bits(attackers);
  return iVar3;
}

Assistant:

int STATE_checkers_and_pinners(const chess_state_t *s, bitboard_t *block_check, bitboard_t *pinners, bitboard_t *pinned)
{
    const int player = s->player;
    const int opponent = player ^ 1;
    const bitboard_t * player_bb = &s->bitboard[player * NUM_TYPES];
    const bitboard_t * opponent_bb = &s->bitboard[opponent * NUM_TYPES];
    int king_pos = BITBOARD_find_bit(player_bb[KING]);
    bitboard_t checkers = 0;
    *block_check = 0;
    *pinners = 0;
    *pinned = 0;

    /* Attacking pawns */
    checkers |= bitboard_pawn_capture[player][king_pos] & opponent_bb[PAWN];

    /* Attacking knights */
    checkers |= bitboard_knight[king_pos] & opponent_bb[KNIGHT];

    /* Attacking sliders */
    bitboard_t attackers = (bitboard_bishop[king_pos] & (opponent_bb[BISHOP] | opponent_bb[QUEEN])) |
                           (bitboard_rook[king_pos] & (opponent_bb[ROOK] | opponent_bb[QUEEN]));
    while(attackers) {
        int attack_pos = BITBOARD_find_bit(attackers);
        bitboard_t attacker_bb = BITBOARD_POSITION(attack_pos);
        bitboard_t between = bitboard_between[attack_pos][king_pos];
        bitboard_t own_between = between & player_bb[ALL];
        bitboard_t opponent_between = between & opponent_bb[ALL];

        if(opponent_between == 0) {
            if(own_between == 0) {
                /* Slider is checking */
                checkers |= attacker_bb;
                *block_check |= between;
            } else if(BITBOARD_count_bits(own_between) == 1) {
                /* Slider is pinning */
                *pinners |= attacker_bb;
                *pinned |= own_between;
            }
        }

        attackers ^= attacker_bb;
    }

    *block_check |= checkers;

    /* Return number of checkers */
    return BITBOARD_count_bits(checkers);
}